

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonFun.cpp
# Opt level: O2

bool setNonBlocking(int fd,bool unBlock)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = false;
  uVar1 = fcntl(fd,3);
  if (uVar1 != 0xffffffff) {
    iVar2 = fcntl(fd,4,(ulong)((uint)unBlock << 0xb | uVar1 & 0xfffff7ff));
    bVar3 = iVar2 != -1;
  }
  return bVar3;
}

Assistant:

bool setNonBlocking(int fd, bool unBlock)
{
    int flags = fcntl(fd,F_GETFL);
    if (flags == -1)
        return false;

    if (unBlock)
        flags |= O_NONBLOCK;
    else
        flags &= ~O_NONBLOCK;

    if (fcntl(fd,F_SETFL,flags) == -1)
        return false;
    return true;
}